

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::readQualities(Graph *this)

{
  vector<int,std::allocator<int>> *this_00;
  long lVar1;
  iterator __position;
  long lVar2;
  char cVar3;
  long *plVar4;
  int num;
  string quality;
  stringstream ss;
  fstream file;
  undefined1 auStack_408 [12];
  int local_3fc;
  long local_3f8;
  char *local_3f0;
  undefined8 local_3e8;
  char local_3e0;
  undefined7 uStack_3df;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_3d0;
  void *local_3c8;
  undefined8 uStack_3c0;
  long local_3b8;
  ios_base local_348 [264];
  long local_240 [4];
  byte abStack_220 [496];
  
  std::fstream::fstream(local_240,"qualities.qual",_S_in);
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = '\0';
  lVar1 = *(long *)(local_240[0] + -0x18);
  if ((abStack_220[lVar1] & 2) == 0) {
    local_3d0 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                 *)&this->qualities;
    local_3f8 = -1;
    lVar2 = local_3f8;
    do {
      while( true ) {
        cVar3 = std::ios::widen((char)auStack_408 + (char)lVar1 + -0x38);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_240,(string *)&local_3f0,cVar3);
        if (*local_3f0 == '>') break;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_3c8,(string *)&local_3f0,_S_out|_S_in);
        while (plVar4 = (long *)std::istream::operator>>((istream *)&local_3c8,&local_3fc),
              (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
          this_00 = (vector<int,std::allocator<int>> *)
                    ((this->qualities).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar2);
          __position._M_current = *(int **)(this_00 + 8);
          if (__position._M_current == *(int **)(this_00 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_00,__position,&local_3fc);
          }
          else {
            *__position._M_current = local_3fc;
            *(int **)(this_00 + 8) = __position._M_current + 1;
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c8);
        std::ios_base::~ios_base(local_348);
        lVar1 = *(long *)(local_240[0] + -0x18);
        if ((abStack_220[lVar1] & 2) != 0) goto LAB_00103761;
      }
      local_3c8 = (void *)0x0;
      uStack_3c0 = 0;
      local_3b8 = 0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                (local_3d0,(vector<int,_std::allocator<int>_> *)&local_3c8);
      if (local_3c8 != (void *)0x0) {
        operator_delete(local_3c8,local_3b8 - (long)local_3c8);
      }
      local_3f8 = local_3f8 + 1;
      lVar1 = *(long *)(local_240[0] + -0x18);
      lVar2 = local_3f8;
    } while ((abStack_220[lVar1] & 2) == 0);
  }
LAB_00103761:
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void Graph::readQualities(){
    fstream file("qualities.qual", ios::in);
    string quality;
    int row = -1;
    while(!file.eof()){
        getline(file, quality);
        if(quality[0] == '>'){
            this->qualities.emplace_back(vector<int>());
            row++;
            continue;
        }else{
            stringstream ss(quality);
            int num;
            while(ss >> num){
                this->qualities[row].push_back(num);
            }
        }
    }
}